

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_base.h
# Opt level: O1

void test_uintwide_t_n_base::
     get_equal_random_test_values_boost_and_local_n<math::wide_integer::uintwide_t<512u,unsigned_int,void,false>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,void>
               (uintwide_t<24U,_unsigned_char,_void,_false> *u_local,
               number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
               *u_boost,size_t count)

{
  anon_class_32_4_006e9c57 parallel_function;
  uint uVar1;
  random_engine_type *prVar2;
  uint uVar3;
  atomic_flag rnd_lock;
  atomic_flag local_d9;
  uintwide_t<24U,_unsigned_char,_void,_false> **local_d8;
  number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
  **ppnStack_d0;
  undefined1 *local_c8;
  atomic_flag *paStack_c0;
  number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
  *local_b8;
  uintwide_t<24U,_unsigned_char,_void,_false> *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  local_b8 = u_boost;
  local_b0 = u_local;
  prVar2 = my_random_generator();
  uVar1 = util::util_pseudorandom_time_point_seed::value<unsigned_int>();
  uVar3 = uVar1 / 0x7fffffff << 0x1f | uVar1 / 0x7fffffff;
  prVar2->_M_x = uVar3 + uVar1 + (uint)(uVar1 + uVar3 == 0);
  local_c8 = local_a8;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_68 = 0xffffffff;
  uStack_64 = 0xffffffff;
  uStack_60 = 0xffffffff;
  uStack_5c = 0xffffffff;
  local_58 = 0xffffffff;
  uStack_54 = 0xffffffff;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  local_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  local_38 = 0xffffffff;
  uStack_34 = 0xffffffff;
  uStack_30 = 0xffffffff;
  uStack_2c = 0xffffffff;
  paStack_c0 = &local_d9;
  local_d9.super___atomic_flag_base._M_i = (__atomic_flag_base)false;
  parallel_function.u_boost = &local_b8;
  parallel_function.u_local = &local_b0;
  parallel_function.distribution = (distribution_type *)local_c8;
  parallel_function.rnd_lock = paStack_c0;
  local_d8 = &local_b0;
  ppnStack_d0 = &local_b8;
  my_concurrency::
  parallel_for<unsigned_long,test_uintwide_t_n_base::get_equal_random_test_values_boost_and_local_n<math::wide_integer::uintwide_t<512u,unsigned_int,void,false>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,void>(math::wide_integer::uintwide_t<512u,unsigned_int,void,false>*,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>*,unsigned_long)::_lambda(unsigned_long)_1_>
            (0,count,parallel_function);
  return;
}

Assistant:

static auto get_equal_random_test_values_boost_and_local_n(      OtherLocalUintType* u_local,
                                                                     OtherBoostUintType* u_boost,
                                                               const std::size_t         count) -> void
    {
      using other_local_uint_type = OtherLocalUintType;
      using other_boost_uint_type = OtherBoostUintType;

      my_random_generator().seed(util::util_pseudorandom_time_point_seed::value<typename random_engine_type::result_type>());

      #if defined(WIDE_INTEGER_NAMESPACE)
      using distribution_type =
        WIDE_INTEGER_NAMESPACE::math::wide_integer::uniform_int_distribution<other_local_uint_type::my_width2, typename other_local_uint_type::limb_type, AllocatorType>;
      #else
      using distribution_type =
        ::math::wide_integer::uniform_int_distribution<other_local_uint_type::my_width2, typename other_local_uint_type::limb_type, AllocatorType>;
      #endif

      distribution_type distribution;

      std::atomic_flag rnd_lock = ATOMIC_FLAG_INIT;

      my_concurrency::parallel_for
      (
        static_cast<std::size_t>(0U),
        count,
        [&u_local, &u_boost, &distribution, &rnd_lock](std::size_t i)
        {
          while(rnd_lock.test_and_set()) { ; }
          const other_local_uint_type a = distribution(my_random_generator());
          rnd_lock.clear();

          u_local[i] = a;                                                // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
          u_boost[i] = other_boost_uint_type("0x" + hexlexical_cast(a)); // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
        }
      );
    }